

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsg_model.c
# Opt level: O3

int fsg_model_word_add(fsg_model_t *fsg,char *word)

{
  int iVar1;
  char **ppcVar2;
  bitvec_t *pbVar3;
  char *pcVar4;
  size_t old_len;
  
  iVar1 = fsg_model_word_id(fsg,word);
  if (iVar1 == -1) {
    iVar1 = fsg->n_word;
    old_len = (size_t)iVar1;
    if (iVar1 == fsg->n_word_alloc) {
      fsg->n_word_alloc = iVar1 + 10;
      ppcVar2 = (char **)__ckd_realloc__(fsg->vocab,old_len * 8 + 0x50,
                                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/fsg_model.c"
                                         ,0x17e);
      fsg->vocab = ppcVar2;
      if (fsg->silwords != (bitvec_t *)0x0) {
        pbVar3 = bitvec_realloc(fsg->silwords,old_len,(long)fsg->n_word_alloc);
        fsg->silwords = pbVar3;
      }
      if (fsg->altwords != (bitvec_t *)0x0) {
        pbVar3 = bitvec_realloc(fsg->altwords,old_len,(long)fsg->n_word_alloc);
        fsg->altwords = pbVar3;
      }
    }
    fsg->n_word = fsg->n_word + 1;
    pcVar4 = __ckd_salloc__(word,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/fsg_model.c"
                            ,0x189);
    fsg->vocab[old_len] = pcVar4;
  }
  return iVar1;
}

Assistant:

int
fsg_model_word_add(fsg_model_t * fsg, char const *word)
{
    int wid, old_size;

    /* Search for an existing word matching this. */
    wid = fsg_model_word_id(fsg, word);
    /* If not found, add this to the vocab. */
    if (wid == -1) {
        wid = fsg->n_word;
        if (fsg->n_word == fsg->n_word_alloc) {
            old_size = fsg->n_word_alloc;
            fsg->n_word_alloc += 10;
            fsg->vocab = ckd_realloc(fsg->vocab,
                                     fsg->n_word_alloc *
                                     sizeof(*fsg->vocab));
            if (fsg->silwords)
                fsg->silwords =
                    bitvec_realloc(fsg->silwords, old_size,
                                   fsg->n_word_alloc);
            if (fsg->altwords)
                fsg->altwords =
                    bitvec_realloc(fsg->altwords, old_size,
                                   fsg->n_word_alloc);
        }
        ++fsg->n_word;
        fsg->vocab[wid] = ckd_salloc(word);
    }
    return wid;
}